

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O0

int CfdDecodeBase64(void *handle,char *base64,char **output)

{
  bool bVar1;
  undefined8 uVar2;
  CfdException *this;
  char *pcVar3;
  undefined8 *in_RDX;
  char *in_RSI;
  CfdException *except;
  exception *std_except;
  ByteData data;
  string *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  CfdError error_code;
  allocator *paVar4;
  CfdException *in_stack_fffffffffffffec0;
  string local_110 [16];
  undefined8 in_stack_ffffffffffffff00;
  allocator local_e9;
  string local_e8 [32];
  ByteData local_c8;
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [32];
  CfdSourceLocation local_88;
  undefined1 local_6a;
  allocator local_69;
  string local_68 [32];
  CfdSourceLocation local_48;
  undefined8 *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_48.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_common.cpp"
                 ,0x2f);
    local_48.filename = local_48.filename + 1;
    local_48.line = 0x34c;
    local_48.funcname = "CfdDecodeBase64";
    cfd::core::logger::warn<>(&local_48,"base64 is null or empty.");
    local_6a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"Failed to parameter. base64 is null or empty.",&local_69)
    ;
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffec0,error_code,in_stack_fffffffffffffeb0);
    local_6a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_20 == (undefined8 *)0x0) {
    local_88.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_common.cpp"
                 ,0x2f);
    local_88.filename = local_88.filename + 1;
    local_88.line = 0x352;
    local_88.funcname = "CfdDecodeBase64";
    cfd::core::logger::warn<>(&local_88,"output is null.");
    local_aa = 1;
    this = (CfdException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"Failed to parameter. output is null.",&local_a9);
    cfd::core::CfdException::CfdException(this,error_code,in_stack_fffffffffffffeb0);
    local_aa = 0;
    __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  paVar4 = &local_e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,local_18,paVar4);
  cfd::core::CryptoUtil::DecodeBase64(&local_c8,(string *)local_e8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_110,&local_c8);
  pcVar3 = cfd::capi::CreateString((string *)in_stack_ffffffffffffff00);
  *local_20 = pcVar3;
  std::__cxx11::string::~string(local_110);
  local_4 = 0;
  cfd::core::ByteData::~ByteData((ByteData *)0x579f48);
  return local_4;
}

Assistant:

int CfdDecodeBase64(
    void* handle, const char* base64, char** output) {
  try {
    cfd::Initialize();
    if (cfd::capi::IsEmptyString(base64)) {
      warn(CFD_LOG_SOURCE, "base64 is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. base64 is null or empty.");
    }
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }
    auto data = cfd::core::CryptoUtil::DecodeBase64(std::string(base64));
    *output = cfd::capi::CreateString(data.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return cfd::capi::SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    cfd::capi::SetLastFatalError(handle, std_except.what());
  } catch (...) {
    cfd::capi::SetLastFatalError(handle, "unknown error.");
  }
  return CfdErrorCode::kCfdUnknownError;
}